

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelinePostXFB::Setup(AdvancedPipelinePostXFB *this)

{
  AdvancedPipelinePostXFB *this_local;
  
  memset(this->m_program,0,8);
  this->m_storage_buffer = 0;
  this->m_xfb_buffer = 0;
  this->m_vertex_buffer = 0;
  this->m_vertex_array = 0;
  return 0;
}

Assistant:

virtual long Setup()
	{
		memset(m_program, 0, sizeof(m_program));
		m_storage_buffer = 0;
		m_xfb_buffer	 = 0;
		m_vertex_buffer  = 0;
		m_vertex_array   = 0;
		return NO_ERROR;
	}